

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_tai.cpp
# Opt level: O2

i32_t Kumu::caldate_mjd(caldate *cd)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  
  if (cd == (caldate *)0x0) {
    __assert_fail("cd",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/KM_tai.cpp"
                  ,0x71,"i32_t Kumu::caldate_mjd(const Kumu::TAI::caldate *)");
  }
  iVar2 = cd->month;
  iVar3 = iVar2 + 9;
  if (2 < iVar2) {
    iVar3 = iVar2 + -3;
  }
  iVar4 = (int)((long)iVar3 % 0xc);
  iVar2 = iVar3 / 0xc + (iVar4 >> 0x1f) + (cd->year % 400 - (uint)(iVar2 < 3));
  uVar6 = (ulong)(iVar4 + 0xc);
  if (-1 < iVar4) {
    uVar6 = (long)iVar3 % 0xc & 0xffffffff;
  }
  uVar1 = (long)iVar2 % 400;
  iVar3 = (iVar2 / 400 + cd->year / 400) * 0x23ab1;
  iVar5 = cd->day + *(int *)(montab + uVar6 * 4);
  iVar4 = (int)uVar1;
  uVar6 = (ulong)(iVar4 + 400);
  iVar2 = iVar3 + -0xc9693 + iVar5;
  if (-1 < iVar4) {
    uVar6 = uVar1 & 0xffffffff;
    iVar2 = iVar3 + iVar5 + -0xa5be2;
  }
  return (int)((uVar6 >> 2) % 0x19) * 0x5b5 + iVar2 +
         *(int *)(times36524 + (ulong)((uint)(uVar6 / 100) & 3) * 4) +
         *(int *)(times365 + (ulong)((uint)uVar6 & 3) * 4);
}

Assistant:

i32_t
caldate_mjd(const Kumu::TAI::caldate* cd)
{
  assert(cd);
  i32_t y, m, d;

  d = cd->day - 678882L;
  m = cd->month - 1;
  y = cd->year;

  d += 146097L * (y / 400);
  y %= 400;

  if (m >= 2) m -= 2; else { m += 10; --y; }

  y += (m / 12);
  m %= 12;
  if (m < 0) { m += 12; --y; }

  d += montab[m];

  d += 146097L * (y / 400);
  y %= 400;
  if (y < 0) { y += 400; d -= 146097L; }

  d += times365[y & 3];
  y >>= 2;

  d += 1461L * (y % 25);
  y /= 25;

  d += times36524[y & 3];

  return d;
}